

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camgeom.cc
# Opt level: O1

void gmath::refineOptimal(Matrix34d *RT1,Vector3d *p0,Vector3d *p1)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int i_5;
  long lVar5;
  undefined1 *puVar6;
  int k;
  double (*padVar7) [4];
  double *pdVar8;
  undefined8 *puVar9;
  double *pdVar10;
  undefined8 *puVar11;
  int i;
  long lVar12;
  int i_13;
  int j;
  long lVar13;
  int j_6;
  int j_5;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  Polynomiald p;
  Vector3d e0;
  SMatrix<double,_3,_3> ret_2;
  SVector<double,_3> ret_13;
  Vector3d e1;
  Matrix33d R0;
  SMatrix<double,_3,_3> ret_8;
  Matrix33d invT0;
  Matrix33d R1;
  Vector3d T;
  Matrix33d F;
  vector<double,_std::allocator<double>_> r;
  Matrix33d invT1;
  Matrix33d R;
  Polynomial<double> local_478;
  double local_468;
  ulong uStack_460;
  double local_458 [4];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined8 local_3f8;
  double local_3e8;
  ulong uStack_3e0;
  undefined1 local_3d8 [16];
  double local_3c8;
  double local_3c0;
  double local_3b8 [4];
  double local_398;
  undefined8 uStack_390;
  double local_388;
  ulong uStack_380;
  double local_378;
  undefined8 uStack_370;
  undefined1 local_368 [8];
  double dStack_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined8 local_328;
  double local_318;
  undefined8 uStack_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined1 local_218 [16];
  double local_208;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  ulong uStack_1d0;
  double local_1c8 [10];
  double local_178;
  double local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  double local_c8 [10];
  double local_78;
  undefined8 uStack_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  double local_38;
  ulong uStack_30;
  
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[8] = 0.0;
  lVar5 = 0;
  auVar28 = _DAT_00121070;
  do {
    if (SUB164(auVar28 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar28 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)((long)local_c8 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_c8 + lVar5 + 0x20) = 0x3ff0000000000000;
    }
    lVar12 = auVar28._8_8_;
    auVar28._0_8_ = auVar28._0_8_ + 2;
    auVar28._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  lVar5 = 0;
  padVar7 = (double (*) [4])RT1;
  do {
    *(double *)((long)local_c8 + lVar5 + 0x10) = (*(double (*) [4])*padVar7)[2];
    dVar24 = (*(double (*) [4])*padVar7)[1];
    *(double *)((long)local_c8 + lVar5) = (*(double (*) [4])*padVar7)[0];
    *(double *)((long)local_c8 + lVar5 + 8) = dVar24;
    lVar5 = lVar5 + 0x18;
    padVar7 = padVar7 + 1;
  } while (lVar5 != 0x48);
  local_218 = (undefined1  [16])0x0;
  local_208 = 0.0;
  lVar5 = 0;
  do {
    *(undefined8 *)(local_218 + lVar5) = *(undefined8 *)((long)RT1->v[0] + lVar5 * 4 + 0x18);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  lVar5 = 0;
  auVar32 = _DAT_00121070;
  do {
    if (SUB164(auVar32 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar32 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_2b8 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_298 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar32._8_8_;
    auVar32._0_8_ = auVar32._0_8_ + 2;
    auVar32._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  lVar5 = 0;
  local_2b8._8_8_ = 0;
  local_2b8._0_8_ = -local_208;
  local_2b8 = local_2b8 << 0x40;
  local_2a8._0_8_ = local_218._8_8_;
  local_2a8._8_8_ = local_208;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_218._0_8_ ^ 0x8000000000000000;
  local_298 = auVar4 << 0x40;
  local_288._0_8_ = local_2a8._0_8_ ^ 0x8000000000000000;
  local_288._8_4_ = local_218._0_4_;
  local_288._12_4_ = local_218._4_4_;
  local_278 = 0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  local_1c8[3] = 0.0;
  local_1c8[4] = 0.0;
  local_1c8[5] = 0.0;
  local_1c8[6] = 0.0;
  local_1c8[7] = 0.0;
  local_1c8[8] = 0.0;
  auVar25 = _DAT_00121070;
  do {
    if (SUB164(auVar25 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar25 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)((long)local_1c8 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_1c8 + lVar5 + 0x20) = 0x3ff0000000000000;
    }
    lVar12 = auVar25._8_8_;
    auVar25._0_8_ = auVar25._0_8_ + 2;
    auVar25._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_2b8;
  lVar5 = 0;
  do {
    lVar12 = 0;
    pdVar8 = local_c8;
    do {
      local_1c8[lVar5 * 3 + lVar12] = 0.0;
      dVar24 = 0.0;
      lVar13 = 0;
      pdVar10 = pdVar8;
      do {
        dVar24 = dVar24 + *(double *)(puVar6 + lVar13 * 8) * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      local_1c8[lVar5 * 3 + lVar12] = dVar24;
      lVar12 = lVar12 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  local_288 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_278 = 0;
  lVar5 = 0;
  auVar26 = _DAT_00121070;
  do {
    if (SUB164(auVar26 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar26 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_2b8 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_298 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar26._8_8_;
    auVar26._0_8_ = auVar26._0_8_ + 2;
    auVar26._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_d8 = 0;
  lVar5 = 0;
  auVar27 = _DAT_00121070;
  do {
    if (SUB164(auVar27 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar27 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_118 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_f8 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar27._8_8_;
    auVar27._0_8_ = auVar27._0_8_ + 2;
    auVar27._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  auVar31._8_8_ = p0->v[2];
  auVar31._0_8_ = p0->v[2];
  auVar28 = divpd(*(undefined1 (*) [16])p0->v,auVar31);
  local_2a8._0_8_ = auVar28._0_8_;
  local_298._8_8_ = auVar28._8_8_;
  auVar34._8_8_ = p1->v[2];
  auVar34._0_8_ = p1->v[2];
  auVar32 = divpd(*(undefined1 (*) [16])p1->v,auVar34);
  local_108._0_8_ = auVar32._0_8_;
  local_f8._8_8_ = auVar32._8_8_;
  local_408 = ZEXT816(0);
  local_418 = ZEXT816(0);
  local_428 = ZEXT816(0);
  local_438 = ZEXT816(0);
  local_3f8 = 0;
  lVar5 = 0;
  auVar35 = _DAT_00121070;
  do {
    if (SUB164(auVar35 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar35 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_438 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_418 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar35._8_8_;
    auVar35._0_8_ = auVar35._0_8_ + 2;
    auVar35._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_438;
  puVar9 = (undefined8 *)local_118;
  lVar5 = 0;
  do {
    lVar12 = 0;
    puVar11 = puVar9;
    do {
      *(undefined8 *)(puVar6 + lVar12 * 8) = *puVar11;
      lVar12 = lVar12 + 1;
      puVar11 = puVar11 + 3;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
    puVar9 = puVar9 + 1;
  } while (lVar5 != 3);
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_228 = 0;
  lVar5 = 0;
  auVar36 = _DAT_00121070;
  do {
    if (SUB164(auVar36 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar36 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_268 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_248 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar36._8_8_;
    auVar36._0_8_ = auVar36._0_8_ + 2;
    auVar36._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_438;
  lVar5 = 0;
  do {
    lVar12 = 0;
    pdVar8 = local_1c8;
    do {
      *(double *)(local_268 + lVar12 * 8 + lVar5 * 0x18) = 0.0;
      dVar24 = 0.0;
      lVar13 = 0;
      pdVar10 = pdVar8;
      do {
        dVar24 = dVar24 + *(double *)(puVar6 + lVar13 * 8) * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      *(double *)(local_268 + lVar12 * 8 + lVar5 * 0x18) = dVar24;
      lVar12 = lVar12 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  local_338 = (undefined1  [16])0x0;
  local_348 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  _local_368 = (undefined1  [16])0x0;
  local_328 = 0;
  lVar5 = 0;
  auVar37 = _DAT_00121070;
  do {
    if (SUB164(auVar37 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar37 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_368 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_348 + lVar5) = 0x3ff0000000000000;
    }
    dVar24 = local_208;
    lVar12 = auVar37._8_8_;
    auVar37._0_8_ = auVar37._0_8_ + 2;
    auVar37._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_268;
  lVar5 = 0;
  do {
    lVar12 = 0;
    pdVar8 = (double *)local_2b8;
    do {
      *(double *)(local_368 + lVar12 * 8 + lVar5 * 0x18) = 0.0;
      dVar33 = 0.0;
      lVar13 = 0;
      pdVar10 = pdVar8;
      do {
        dVar33 = dVar33 + *(double *)(puVar6 + lVar13 * 8) * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      *(double *)(local_368 + lVar12 * 8 + lVar5 * 0x18) = dVar33;
      lVar12 = lVar12 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)local_1c8 + lVar5 + 0x10) = *(undefined8 *)(local_358 + lVar5);
    uVar2 = *(undefined8 *)(local_368 + lVar5 + 8);
    *(undefined8 *)((long)local_1c8 + lVar5) = *(undefined8 *)(local_368 + lVar5);
    *(undefined8 *)((long)local_1c8 + lVar5 + 8) = uVar2;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  local_3b8[2] = local_208;
  local_3b8[0] = (double)local_218._0_8_;
  local_3b8[1] = (double)local_218._8_8_;
  local_338 = ZEXT816(0);
  local_348 = ZEXT816(0);
  local_358 = ZEXT816(0);
  _local_368 = ZEXT816(0);
  local_328 = 0;
  lVar5 = 0;
  auVar38 = _DAT_00121070;
  do {
    if (SUB164(auVar38 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar38 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_368 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_348 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar38._8_8_;
    auVar38._0_8_ = auVar38._0_8_ + 2;
    auVar38._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_368;
  pdVar8 = local_c8;
  lVar5 = 0;
  do {
    lVar12 = 0;
    pdVar10 = pdVar8;
    do {
      *(double *)(puVar6 + lVar12 * 8) = *pdVar10;
      lVar12 = lVar12 + 1;
      pdVar10 = pdVar10 + 3;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
    pdVar8 = pdVar8 + 1;
  } while (lVar5 != 3);
  local_268 = (undefined1  [16])0x0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_258._8_8_;
  local_258 = auVar3 << 0x40;
  lVar5 = 0;
  do {
    *(ulong *)(local_268 + lVar5 * 8) = *(ulong *)(local_218 + lVar5 * 8) ^ 0x8000000000000000;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_458[0] = 0.0;
  local_458[1] = 0.0;
  local_458[2] = 0.0;
  puVar6 = local_368;
  lVar5 = 0;
  do {
    dVar33 = local_458[lVar5];
    lVar12 = 0;
    do {
      dVar33 = dVar33 + *(double *)(puVar6 + lVar12 * 8) * *(double *)(local_268 + lVar12 * 8);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    local_458[lVar5] = dVar33;
    dVar33 = local_458[2];
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    local_458[lVar5] = local_458[lVar5] / dVar33;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    local_3b8[lVar5] = local_3b8[lVar5] / dVar24;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_458[0] = local_458[0] - auVar28._0_8_;
  local_458[1] = local_458[1] - auVar28._8_8_;
  dVar33 = local_3b8[0] - auVar32._0_8_;
  dVar40 = local_3b8[1] - auVar32._8_8_;
  local_3b8[0] = dVar33;
  local_3b8[1] = dVar40;
  dVar24 = local_458[0] * local_458[0] + local_458[1] * local_458[1];
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  lVar5 = 0;
  do {
    local_458[lVar5] = local_458[lVar5] / dVar24;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  dVar24 = dVar33 * dVar33 + dVar40 * dVar40;
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  lVar5 = 0;
  do {
    local_3b8[lVar5] = local_3b8[lVar5] / dVar24;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_338 = ZEXT816(0);
  local_348 = ZEXT816(0);
  local_358 = ZEXT816(0);
  lVar5 = 0;
  auVar15 = _DAT_00121070;
  do {
    if (SUB164(auVar15 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar15 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_368 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_348 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 2;
    auVar15._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  dStack_360 = local_458[1];
  local_368 = (undefined1  [8])local_458[0];
  local_358._8_8_ = (ulong)local_458[1] ^ (ulong)DAT_001210b0;
  local_348._0_8_ = local_458[0];
  local_328 = 0x3ff0000000000000;
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  lVar5 = 0;
  auVar16 = _DAT_00121070;
  do {
    if (SUB164(auVar16 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar16 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_268 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_248 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 2;
    auVar16._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  local_268._8_8_ = local_3b8[1];
  local_268._0_8_ = local_3b8[0];
  local_258._8_8_ = (ulong)local_3b8[1] ^ (ulong)DAT_001210b0;
  local_248._0_8_ = local_3b8[0];
  local_228 = 0x3ff0000000000000;
  local_2d8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2c8 = 0;
  lVar5 = 0;
  auVar17 = _DAT_00121070;
  do {
    if (SUB164(auVar17 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar17 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_308 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_2e8 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 2;
    auVar17._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_268;
  lVar5 = 0;
  do {
    lVar12 = 0;
    pdVar8 = local_1c8;
    do {
      *(double *)(local_308 + lVar12 * 8 + lVar5 * 0x18) = 0.0;
      dVar24 = 0.0;
      lVar13 = 0;
      pdVar10 = pdVar8;
      do {
        dVar24 = dVar24 + *(double *)(puVar6 + lVar13 * 8) * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      *(double *)(local_308 + lVar12 * 8 + lVar5 * 0x18) = dVar24;
      lVar12 = lVar12 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_128 = 0;
  lVar5 = 0;
  auVar18 = _DAT_00121070;
  do {
    if (SUB164(auVar18 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar18 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_168 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_148 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 2;
    auVar18._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_168;
  puVar9 = (undefined8 *)local_368;
  lVar5 = 0;
  do {
    lVar12 = 0;
    puVar11 = puVar9;
    do {
      *(undefined8 *)(puVar6 + lVar12 * 8) = *puVar11;
      lVar12 = lVar12 + 1;
      puVar11 = puVar11 + 3;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
    puVar9 = puVar9 + 1;
  } while (lVar5 != 3);
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_3f8 = 0;
  lVar5 = 0;
  auVar19 = _DAT_00121070;
  do {
    if (SUB164(auVar19 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar19 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_438 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_418 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 2;
    auVar19._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_308;
  lVar5 = 0;
  do {
    lVar12 = 0;
    pdVar8 = (double *)local_168;
    do {
      *(double *)(local_438 + lVar12 * 8 + lVar5 * 0x18) = 0.0;
      dVar24 = 0.0;
      lVar13 = 0;
      pdVar10 = pdVar8;
      do {
        dVar24 = dVar24 + *(double *)(puVar6 + lVar13 * 8) * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      *(double *)(local_438 + lVar12 * 8 + lVar5 * 0x18) = dVar24;
      lVar12 = lVar12 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)local_1c8 + lVar5 + 0x10) = *(undefined8 *)(local_428 + lVar5);
    uVar2 = *(undefined8 *)(local_438 + lVar5 + 8);
    *(undefined8 *)((long)local_1c8 + lVar5) = *(undefined8 *)(local_438 + lVar5);
    *(undefined8 *)((long)local_1c8 + lVar5 + 8) = uVar2;
    dVar40 = local_1c8[8];
    dVar33 = local_1c8[7];
    dVar24 = local_1c8[5];
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  local_3c0 = local_458[2];
  local_1e8 = local_3b8[2];
  uStack_1e0 = 0;
  local_468 = local_1c8[4];
  uStack_460 = 0;
  local_3e8 = local_1c8[5] * local_1c8[5];
  dVar14 = local_1c8[8] * local_1c8[8];
  local_478.len = 0xc;
  local_478.used = 0;
  local_478.c = (double *)operator_new__(0x60);
  local_478.used = 1;
  *local_478.c = 0.0;
  local_1d8 = local_468 * dVar24;
  uStack_1d0 = uStack_460;
  uStack_30 = uStack_460 ^ 0x8000000000000000;
  local_38 = -local_1d8 * dVar14;
  local_170 = local_3e8 * dVar33 * dVar40;
  Polynomial<double>::set(&local_478,0,local_170 + local_38);
  local_378 = local_1e8 * local_1e8;
  local_388 = local_468 * local_468;
  local_398 = dVar33 * dVar33;
  uStack_390 = 0;
  local_178 = local_3e8 * local_398;
  uStack_380 = uStack_460;
  local_318 = local_3e8 + local_3e8;
  uStack_370 = uStack_1e0;
  Polynomial<double>::set
            (&local_478,1,
             dVar14 * dVar14 * local_378 * local_378 +
             local_318 * dVar14 * local_378 +
             ((local_3e8 * local_3e8 + local_178) - local_388 * dVar14));
  local_1f8 = local_3c0 * local_3c0;
  local_68 = -local_388;
  uStack_60 = uStack_380 ^ 0x8000000000000000;
  local_1d8 = local_1d8 * local_398;
  local_78 = dVar33 * local_68 * dVar40;
  uStack_70 = 0;
  local_58 = (local_468 + local_468) * dVar24;
  uStack_50 = uStack_460;
  uStack_1f0 = 0;
  local_48 = local_468 * 4.0 * dVar24;
  uStack_40 = uStack_460;
  Polynomial<double>::set
            (&local_478,2,
             dVar33 * 4.0 * dVar14 * dVar40 * local_378 * local_378 +
             local_48 * dVar14 * local_378 +
             local_3e8 * 4.0 * dVar33 * dVar40 * local_378 +
             ((dVar33 * local_318 * dVar40 * local_1f8 +
              local_468 * 4.0 * local_3e8 * dVar24 + local_1d8 + local_78) -
             dVar14 * local_58 * local_1f8));
  dVar29 = local_388 * 6.0 * local_3e8;
  local_3e8 = local_388 + local_388;
  uStack_3e0 = uStack_380;
  Polynomial<double>::set
            (&local_478,3,
             local_398 * 6.0 * dVar14 * local_378 * local_378 +
             local_3e8 * dVar14 * local_378 +
             local_468 * 8.0 * dVar24 * dVar33 * dVar40 * local_378 +
             local_318 * local_398 * local_378 +
             ((dVar29 + local_1f8 * local_318 * local_398) - local_3e8 * dVar14 * local_1f8));
  local_318 = local_1f8 * local_1f8;
  uStack_310 = uStack_1f0;
  Polynomial<double>::set
            (&local_478,4,
             local_398 * 4.0 * dVar33 * dVar40 * local_378 * local_378 +
             local_388 * 4.0 * dVar33 * dVar40 * local_378 +
             local_48 * local_398 * local_378 +
             local_38 * local_318 +
             local_170 * local_318 +
             ((local_468 * local_388 * 4.0 * dVar24 + local_58 * local_398 * local_1f8) -
             dVar33 * local_3e8 * dVar40 * local_1f8));
  Polynomial<double>::set
            (&local_478,5,
             local_398 * local_398 * local_378 * local_378 +
             local_3e8 * local_398 * local_378 +
             dVar14 * local_68 * local_318 + local_388 * local_388 + local_178 * local_318);
  Polynomial<double>::set(&local_478,6,local_1d8 * local_318 + local_78 * local_318);
  realRoots((vector<double,_std::allocator<double>_> *)local_168,&local_478);
  uVar2 = local_168._0_8_;
  if (local_168._8_8_ - local_168._0_8_ == 0) {
    dVar14 = 1.79769313486232e+308;
    dVar29 = 1.79769313486232e+308;
  }
  else {
    lVar5 = (long)(local_168._8_8_ - local_168._0_8_) >> 3;
    dVar29 = 1.79769313486232e+308;
    lVar12 = 0;
    dVar14 = 1.79769313486232e+308;
    do {
      dVar30 = *(double *)(local_168._0_8_ + lVar12 * 8);
      dVar42 = local_468 * dVar30 + dVar24;
      dVar43 = dVar33 * dVar30 + dVar40;
      dVar42 = dVar42 * dVar42 + local_378 * dVar43 * dVar43;
      if ((dVar42 != 0.0) || (NAN(dVar42))) {
        auVar44._0_8_ = dVar30 * dVar30;
        auVar44._8_8_ = dVar43 * dVar43;
        auVar1._8_8_ = dVar42;
        auVar1._0_8_ = local_1f8 * dVar30 * dVar30 + 1.0;
        auVar28 = divpd(auVar44,auVar1);
        dVar42 = auVar28._8_8_ + auVar28._0_8_;
        if (dVar42 < dVar29) {
          dVar14 = dVar30;
          dVar29 = dVar42;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar12);
  }
  if (((local_1f8 <= 0.0) || (dVar30 = local_378 * dVar33 * dVar33 + local_388, dVar30 <= 0.0)) ||
     (auVar39._8_8_ = local_398, auVar39._0_8_ = 0x3ff0000000000000, auVar41._8_8_ = dVar30,
     auVar41._0_8_ = local_1f8, auVar28 = divpd(auVar39,auVar41),
     dVar29 <= auVar28._8_8_ + auVar28._0_8_)) {
    p0->v[0] = local_3c0 * dVar14 * dVar14;
    p0->v[1] = dVar14;
    p0->v[2] = dVar14 * dVar14 * local_1f8 + 1.0;
    dVar40 = dVar33 * dVar14 + dVar40;
    dVar24 = local_468 * dVar14 + dVar24;
    p1->v[0] = dVar40 * local_1e8 * dVar40;
    p1->v[1] = dVar40 * -dVar24;
    dVar24 = local_378 * dVar40 * dVar40 + dVar24 * dVar24;
  }
  else {
    p0->v[0] = local_3c0;
    p0->v[1] = 0.0;
    p0->v[2] = local_1f8;
    p1->v[0] = local_398 * local_1e8;
    p1->v[1] = -local_468 * dVar33;
    dVar24 = local_378 * local_398 + local_388;
  }
  p1->v[2] = dVar24;
  auVar28 = _DAT_00121080;
  local_2d8 = ZEXT816(0);
  local_2e8 = ZEXT816(0);
  local_2f8 = ZEXT816(0);
  local_308 = ZEXT816(0);
  local_2c8 = 0;
  lVar5 = 0;
  auVar20 = _DAT_00121070;
  do {
    if (SUB164(auVar20 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar20 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_308 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_2e8 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 2;
    auVar20._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_308;
  puVar9 = (undefined8 *)local_368;
  lVar5 = 0;
  do {
    lVar12 = 0;
    puVar11 = puVar9;
    do {
      *(undefined8 *)(puVar6 + lVar12 * 8) = *puVar11;
      lVar12 = lVar12 + 1;
      puVar11 = puVar11 + 3;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
    puVar9 = puVar9 + 1;
  } while (lVar5 != 3);
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_3f8 = 0;
  lVar5 = 0;
  auVar21 = _DAT_00121070;
  do {
    if (SUB164(auVar21 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar21 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_438 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_418 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar21._8_8_;
    auVar21._0_8_ = auVar21._0_8_ + 2;
    auVar21._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_2b8;
  lVar5 = 0;
  do {
    lVar12 = 0;
    pdVar8 = (double *)local_308;
    do {
      *(double *)(local_438 + lVar12 * 8 + lVar5 * 0x18) = 0.0;
      dVar24 = 0.0;
      lVar13 = 0;
      pdVar10 = pdVar8;
      do {
        dVar24 = dVar24 + *(double *)(puVar6 + lVar13 * 8) * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      *(double *)(local_438 + lVar12 * 8 + lVar5 * 0x18) = dVar24;
      lVar12 = lVar12 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  local_3d8 = (undefined1  [16])0x0;
  local_3c8 = 0.0;
  puVar6 = local_438;
  lVar5 = 0;
  do {
    dVar24 = *(double *)(local_3d8 + lVar5 * 8);
    lVar12 = 0;
    do {
      dVar24 = dVar24 + *(double *)(puVar6 + lVar12 * 8) * p0->v[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    *(double *)(local_3d8 + lVar5 * 8) = dVar24;
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  p0->v[2] = local_3c8;
  p0->v[0] = (double)local_3d8._0_8_;
  p0->v[1] = (double)local_3d8._8_8_;
  local_2d8 = ZEXT816(0);
  local_2e8 = ZEXT816(0);
  local_2f8 = ZEXT816(0);
  local_308 = ZEXT816(0);
  local_2c8 = 0;
  lVar5 = 0;
  auVar22 = _DAT_00121070;
  do {
    auVar32 = auVar22 ^ auVar28;
    if (auVar32._4_4_ == -0x80000000 && auVar32._0_4_ < -0x7ffffffd) {
      *(undefined8 *)(local_308 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_2e8 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 2;
    auVar22._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_308;
  puVar9 = (undefined8 *)local_268;
  lVar5 = 0;
  do {
    lVar12 = 0;
    puVar11 = puVar9;
    do {
      *(undefined8 *)(puVar6 + lVar12 * 8) = *puVar11;
      lVar12 = lVar12 + 1;
      puVar11 = puVar11 + 3;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
    puVar9 = puVar9 + 1;
  } while (lVar5 != 3);
  local_408 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_3f8 = 0;
  lVar5 = 0;
  auVar23 = _DAT_00121070;
  do {
    auVar32 = auVar23 ^ auVar28;
    if (auVar32._4_4_ == -0x80000000 && auVar32._0_4_ < -0x7ffffffd) {
      *(undefined8 *)(local_438 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_418 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 2;
    auVar23._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  puVar6 = local_118;
  lVar5 = 0;
  do {
    lVar12 = 0;
    pdVar8 = (double *)local_308;
    do {
      *(double *)(local_438 + lVar12 * 8 + lVar5 * 0x18) = 0.0;
      dVar24 = 0.0;
      lVar13 = 0;
      pdVar10 = pdVar8;
      do {
        dVar24 = dVar24 + *(double *)(puVar6 + lVar13 * 8) * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      *(double *)(local_438 + lVar12 * 8 + lVar5 * 0x18) = dVar24;
      lVar12 = lVar12 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar12 != 3);
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  local_3d8 = (undefined1  [16])0x0;
  local_3c8 = 0.0;
  puVar6 = local_438;
  lVar5 = 0;
  do {
    dVar24 = *(double *)(local_3d8 + lVar5 * 8);
    lVar12 = 0;
    do {
      dVar24 = dVar24 + *(double *)(puVar6 + lVar12 * 8) * p1->v[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    *(double *)(local_3d8 + lVar5 * 8) = dVar24;
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar5 != 3);
  p1->v[2] = local_3c8;
  p1->v[0] = (double)local_3d8._0_8_;
  p1->v[1] = (double)local_3d8._8_8_;
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2);
  }
  if (local_478.c != (double *)0x0) {
    operator_delete__(local_478.c);
  }
  return;
}

Assistant:

void refineOptimal(const Matrix34d &RT1, Vector3d &p0, Vector3d &p1)
{
  const Matrix33d R=getRotation(RT1);
  const Vector3d T=RT1.getColumn(3);
  Matrix33d F=createEssential(R, T);

  // the implementation follows Hartley and Zisserman's (2003, pp. 318)

  Matrix33d invT0;
  Matrix33d invT1;
  invT0(0, 2)=p0[0]/p0[2];
  invT0(1, 2)=p0[1]/p0[2];
  invT1(0, 2)=p1[0]/p1[2];
  invT1(1, 2)=p1[1]/p1[2];

  // transform F

  F=transpose(invT1)*F*invT0;

  // get epipoles that correspond to new fundamental matrix

  Vector3d e1=T;
  Vector3d e0=transpose(R)*-T;

  e0/=e0[2];
  e1/=e1[2];
  e0[0]-=p0[0]/p0[2];
  e0[1]-=p0[1]/p0[2];
  e1[0]-=p1[0]/p1[2];
  e1[1]-=p1[1]/p1[2];

  // compute rotations

  e0/=sqrt(e0[0]*e0[0]+e0[1]*e0[1]);
  e1/=sqrt(e1[0]*e1[0]+e1[1]*e1[1]);

  Matrix33d R0;
  R0(0, 0)=e0[0];
  R0(0, 1)=e0[1];
  R0(1, 0)=-e0[1];
  R0(1, 1)=e0[0];
  R0(2, 2)=1;

  Matrix33d R1;
  R1(0, 0)=e1[0];
  R1(0, 1)=e1[1];
  R1(1, 0)=-e1[1];
  R1(1, 1)=e1[0];
  R1(2, 2)=1;

  // compute new F

  F=R1*F*transpose(R0);

  // compute coefficients of polynomial

  const double f=e0[2];
  const double g=e1[2];
  const double a=F(1, 1);
  const double b=F(1, 2);
  const double c=F(2, 1);
  const double d=F(2, 2);
  const double f2=f*f;
  const double f4=f2*f2;
  const double g2=g*g;
  const double a2=a*a;
  const double b2=b*b;
  const double c2=c*c;
  const double d2=d*d;

  Polynomiald p;
  p.set(0, b2*c*d-a*b*d2);
  p.set(1, b2*b2+b2*c2-a2*d2+2*b2*d2*g2+d2*d2*g2*g2);
  p.set(2, 4*a*b2*b+a*b*c2-a2*c*d+2*b2*c*d*f2-2*a*b*d2*f2+4*b2*c*d*g2+4*a*b*d2*g2
        +4*c*d2*d*g2*g2);
  p.set(3, 6*a2*b2+2*b2*c2*f2-2*a2*d2*f2+2*b2*c2*g2+8*a*b*c*d*g2+2*a2*d2*g2
        +6*c2*d2*g2*g2);
  p.set(4, 4*a2*a*b+2*a*b*c2*f2-2*a2*c*d*f2+b2*c*d*f4-a*b*d2*f4+4*a*b*c2*g2
        +4*a2*c*d*g2+4*c2*c*d*g2*g2);
  p.set(5, a2*a2+b2*c2*f4-a2*d2*f4+2*a2*c2*g2+c2*c2*g2*g2);
  p.set(6, a*b*c2*f4-a2*c*d*f4);

  // setting polynomial to 0 and get all real roots

  std::vector<double> r=realRoots(p);

  // find global minima (solution is t)

  double t=std::numeric_limits<double>::max();
  double mins=std::numeric_limits<double>::max();

  for (size_t i=0; i<r.size(); i++)
  {
    double s=(a*r[i]+b)*(a*r[i]+b)+g*g*(c*r[i]+d)*(c*r[i]+d);

    if (s != 0)
    {
      s=r[i]*r[i]/(1+f*f*r[i]*r[i])+(c*r[i]+d)*(c*r[i]+d)/s;

      if (s < mins)
      {
        t=r[i];
        mins=s;
      }
    }
  }

  // get optimal corner positions

  if (f*f > 0 && a*a+g*g*c*c > 0 && 1/(f*f)+c*c/(a*a+g*g*c*c) < mins)
  {
    p0[0]=f;
    p0[1]=0;
    p0[2]=f2;
    p1[0]=g*c2;
    p1[1]=-a*c;
    p1[2]=g2*c2+a2;
  }
  else
  {
    p0[0]=t*t*f;
    p0[1]=t;
    p0[2]=t*t*f2+1;
    p1[0]=g*(c*t+d)*(c*t+d);
    p1[1]=-(a*t+b)*(c*t+d);
    p1[2]=g2*(c*t+d)*(c*t+d)+(a*t+b)*(a*t+b);
  }

  // transform refined points back

  p0=invT0*transpose(R0)*p0;
  p1=invT1*transpose(R1)*p1;
}